

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAndroidExtensionPackES31ATests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ImplementationLimitCase::iterate
          (ImplementationLimitCase *this)

{
  bool bVar1;
  int iVar2;
  GLenum GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  int *piVar7;
  MessageBuilder local_350;
  char *local_1d0;
  MessageBuilder local_1c8;
  undefined1 local_34 [8];
  StateQueryMemoryWriteGuard<int> result;
  CallLogWrapper gl;
  ImplementationLimitCase_conflict *this_local;
  
  pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)&result.m_value,(Functions *)CONCAT44(extraout_var,iVar2),pTVar5);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)local_34);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1c8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_1c8,(char (*) [10])0x2b942d5);
  local_1d0 = glu::getGettableStateName(this->m_target);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1d0);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [22])", expecting at least ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_minValue);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1c8);
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)&result.m_value,true);
  GVar3 = this->m_target;
  piVar7 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                     ((StateQueryMemoryWriteGuard<int> *)local_34);
  glu::CallLogWrapper::glGetIntegerv((CallLogWrapper *)&result.m_value,GVar3,piVar7);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)&result.m_value);
  glu::checkError(GVar3,"implementation limit query failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAndroidExtensionPackES31ATests.cpp"
                  ,0x68);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int> *)local_34,
                     (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((bVar1) &&
     (piVar7 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                         ((StateQueryMemoryWriteGuard *)local_34), *piVar7 < this->m_minValue)) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_350,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_350,(char (*) [15])"// ERROR: Got ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(StateQueryMemoryWriteGuard<int> *)local_34);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [21])", expected at least ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_minValue);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_350);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Too low implementation limit");
  }
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)&result.m_value);
  return STOP;
}

Assistant:

ImplementationLimitCase::IterateResult ImplementationLimitCase::iterate (void)
{
	using namespace gls::StateQueryUtil;

	glu::CallLogWrapper						gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	StateQueryMemoryWriteGuard<glw::GLint>	result;

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Querying " << glu::getGettableStateName(m_target) << ", expecting at least " << m_limit
		<< tcu::TestLog::EndMessage;

	gl.enableLogging(true);
	gl.glGetIntegerv(m_target, &result);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "implementation limit query failed");

	if (result.verifyValidity(m_testCtx) && result < m_limit)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "// ERROR: Got " << result << ", expected at least " << m_limit
			<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Too low implementation limit");
	}

	return STOP;
}